

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::describeInterpolation
               (string *stage,VaryingInterpolation qual,ostringstream *name,ostringstream *desc)

{
  Interpolation interpolation;
  ostream *poVar1;
  char *__s;
  string qualName;
  allocator<char> local_39;
  string local_38 [32];
  
  if (qual == VARYINGINTERPOLATION_DEFAULT) {
    poVar1 = std::operator<<(&desc->super_basic_ostream<char,_std::char_traits<char>_>,
                             ", unqualified in ");
    poVar1 = std::operator<<(poVar1,(string *)stage);
    std::operator<<(poVar1," shader");
    return;
  }
  interpolation = getGluInterpolation(qual);
  __s = glu::getInterpolationName(interpolation);
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  poVar1 = std::operator<<(&name->super_basic_ostream<char,_std::char_traits<char>_>,"_");
  poVar1 = std::operator<<(poVar1,(string *)stage);
  poVar1 = std::operator<<(poVar1,"_");
  std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(&desc->super_basic_ostream<char,_std::char_traits<char>_>,
                           ", qualified \'");
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"\' in ");
  poVar1 = std::operator<<(poVar1,(string *)stage);
  std::operator<<(poVar1," shader");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void describeInterpolation (const string& stage, VaryingInterpolation qual,
							ostringstream& name, ostringstream& desc)
{
	DE_ASSERT(qual < VARYINGINTERPOLATION_RANDOM);

	if (qual == VARYINGINTERPOLATION_DEFAULT)
	{
		desc << ", unqualified in " << stage << " shader";
		return;
	}
	else
	{
		const string qualName = glu::getInterpolationName(getGluInterpolation(qual));

		name << "_" << stage << "_" << qualName;
		desc << ", qualified '" << qualName << "' in " << stage << " shader";
	}
}